

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::testDiskAttrValue<Imf_3_4::TypedAttribute<int>>
               (Header *diskHeader,TypedAttribute<int> *testAttribute)

{
  char *__s;
  undefined8 uVar1;
  long lVar2;
  InputExc *this;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  __s = (char *)(**(code **)(*(long *)testAttribute + 0x10))(testAttribute);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  uVar1 = Imf_3_4::Header::operator[]((string *)diskHeader);
  lVar2 = __dynamic_cast(uVar1,&Imf_3_4::Attribute::typeinfo,&Imf_3_4::TypedAttribute<int>::typeinfo
                         ,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  if (*(int *)(lVar2 + 8) == *(int *)(testAttribute + 8)) {
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    return;
  }
  this = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this,"incorrect value from disk");
  __cxa_throw(this,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

void
testDiskAttrValue (const Header& diskHeader, const T& testAttribute)
{
    const string& attrName = testAttribute.typeName ();
    const T&      diskAttr = dynamic_cast<const T&> (diskHeader[attrName]);
    if (diskAttr.value () != testAttribute.value ())
    {
        throw IEX_NAMESPACE::InputExc ("incorrect value from disk");
    }

    return;
}